

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O0

void test_same_two(void)

{
  void *pvVar1;
  void *pvVar2;
  void *c;
  
  pvVar1 = (*hm_new)();
  (*hm_insert)(pvVar1,0x7a,(void *)0x6f,0);
  (*hm_insert)(pvVar1,0x7b,(void *)0x1c8,0);
  (*hm_insert)(pvVar1,0x7b,(void *)0x1c9,0);
  pvVar2 = (*hm_get)(pvVar1,0x7a);
  if (pvVar2 != (void *)0x6f) {
    pvVar1 = (*hm_get)(pvVar1,0x7a);
    printf(anon_var_dwarf_28f,"hm_get(c, 122)",pvVar1,"(void*)111",0x6f,0x8c);
    bad = 1;
    exit(1);
  }
  pvVar2 = (*hm_get)(pvVar1,0x7b);
  if (pvVar2 != (void *)0x1c8) {
    pvVar1 = (*hm_get)(pvVar1,0x7b);
    printf(anon_var_dwarf_28f,"hm_get(c, 123)",pvVar1,"(void*)456",0x1c8,0x8d);
    bad = 1;
    exit(1);
  }
  pvVar2 = (*hm_get)(pvVar1,0x7c);
  if (pvVar2 != (void *)0x0) {
    pvVar1 = (*hm_get)(pvVar1,0x7c);
    printf(anon_var_dwarf_28f,"hm_get(c, 124)",pvVar1,"0",0,0x8e);
    bad = 1;
    exit(1);
  }
  (*hm_delete)(pvVar1);
  return;
}

Assistant:

static void test_same_two()
{
    void *c = hm_new();
    hm_insert(c, 122, (void*)111, 0);
    hm_insert(c, 123, (void*)456, 0);
    hm_insert(c, 123, (void*)457, 0);
    CHECK(hm_get(c, 122), (void*)111);
    CHECK(hm_get(c, 123), (void*)456);
    CHECK(hm_get(c, 124), 0);
    hm_delete(c);
}